

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O3

void __thiscall DCeiling::Tick(DCeiling *this)

{
  bool bVar1;
  EMoveResult EVar2;
  ECeiling EVar3;
  sector_t *sector;
  
  if (this->m_Direction == -1) {
    EVar2 = sector_t::MoveCeiling
                      ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                       this->m_Speed,this->m_BottomHeight,this->m_Crush,-1,
                       this->m_CrushMode == crushHexen);
    if (EVar2 == crushed) {
      if ((this->m_Type & ~ceilRaiseByValue) != ceilCrushAndRaise) {
        return;
      }
      if (this->m_CrushMode != crushSlowdown) {
        return;
      }
      this->m_Speed = 0.125;
      return;
    }
    if (EVar2 != pastdest) {
      return;
    }
    EVar3 = this->m_Type;
    if (0x14 < (int)EVar3) {
      if (EVar3 - genCeilingChg0 < 2) goto LAB_00516d5b;
      goto LAB_00516d8e;
    }
    if ((EVar3 == ceilCrushAndRaise) || (EVar3 == ceilCrushRaiseAndStay)) {
      this->m_Speed = this->m_Speed2;
      this->m_Direction = 1;
      goto LAB_00516dc3;
    }
LAB_00516dd2:
    sector = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
  }
  else {
    if (this->m_Direction != 1) {
      return;
    }
    EVar2 = sector_t::MoveCeiling
                      ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                       this->m_Speed,this->m_TopHeight,-1,1,false);
    if (EVar2 != pastdest) {
      return;
    }
    EVar3 = this->m_Type;
    if (EVar3 - genCeilingChg0 < 2) {
LAB_00516d5b:
      sector_t::SetSpecial
                ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,
                 &this->m_NewSpecial);
    }
    else {
      if (EVar3 == ceilCrushAndRaise) {
        this->m_Direction = -1;
        this->m_Speed = this->m_Speed1;
LAB_00516dc3:
        bVar1 = SN_IsMakingLoopingSound
                          ((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector);
        if (bVar1) {
          return;
        }
        PlayCeilingSound(this);
        return;
      }
LAB_00516d8e:
      if (EVar3 != genCeilingChg) goto LAB_00516dd2;
    }
    sector = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
    sector->planes[1].Texture.texnum = (this->m_Texture).texnum;
  }
  SN_StopSequence(sector,2);
  (*(this->super_DMovingCeiling).super_DMover.super_DSectorEffect.super_DThinker.super_DObject.
    _vptr_DObject[4])(this);
  return;
}

Assistant:

void DCeiling::Tick ()
{
	EMoveResult res;
		
	switch (m_Direction)
	{
	case 0:
		// IN STASIS
		break;
	case 1:
		// UP
		res = m_Sector->MoveCeiling (m_Speed, m_TopHeight, m_Direction);
		
		if (res == EMoveResult::pastdest)
		{
			switch (m_Type)
			{
			case DCeiling::ceilCrushAndRaise:
				m_Direction = -1;
				m_Speed = m_Speed1;
				if (!SN_IsMakingLoopingSound (m_Sector))
					PlayCeilingSound ();
				break;
				
			// movers with texture change, change the texture then get removed
			case genCeilingChgT:
			case genCeilingChg0:
				m_Sector->SetSpecial(&m_NewSpecial);
				// fall through
			case genCeilingChg:
				m_Sector->SetTexture(sector_t::ceiling, m_Texture);
				// fall through
			default:
				SN_StopSequence (m_Sector, CHAN_CEILING);
				Destroy ();
				break;
			}
		}
		break;
		
	case -1:
		// DOWN
		res = m_Sector->MoveCeiling (m_Speed, m_BottomHeight, m_Crush, m_Direction, m_CrushMode == ECrushMode::crushHexen);
		
		if (res == EMoveResult::pastdest)
		{
			switch (m_Type)
			{
			case DCeiling::ceilCrushAndRaise:
			case DCeiling::ceilCrushRaiseAndStay:
				m_Speed = m_Speed2;
				m_Direction = 1;
				if (!SN_IsMakingLoopingSound (m_Sector))
					PlayCeilingSound ();
				break;

			// in the case of ceiling mover/changer, change the texture
			// then remove the active ceiling
			case genCeilingChgT:
			case genCeilingChg0:
				m_Sector->SetSpecial(&m_NewSpecial);
				// fall through
			case genCeilingChg:
				m_Sector->SetTexture(sector_t::ceiling, m_Texture);
				// fall through
			default:
				SN_StopSequence (m_Sector, CHAN_CEILING);
				Destroy ();
				break;
			}
		}
		else // ( res != pastdest )
		{
			if (res == EMoveResult::crushed)
			{
				switch (m_Type)
				{
				case DCeiling::ceilCrushAndRaise:
				case DCeiling::ceilLowerAndCrush:
					if (m_CrushMode == ECrushMode::crushSlowdown)
						m_Speed = 1. / 8;
						break;

				default:
					break;
				}
			}
		}
		break;
	}
}